

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Edg_ObjImprove(Gia_Man_t *p,int iObj,int nEdgeLimit,int DelayMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint local_88;
  uint local_74;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int pFanouts [4];
  int pFanins [4];
  
  iVar1 = Vec_IntEntry(p->vEdgeDelayR,iObj);
  local_74 = 0;
  local_68 = 0;
  local_60 = 0;
  uVar12 = 0;
  for (iVar11 = 0; iVar2 = Gia_ObjLutSize2(p,iObj), iVar11 < iVar2; iVar11 = iVar11 + 1) {
    iVar2 = Gia_ObjLutFanin2(p,iObj,iVar11);
    pGVar6 = Gia_ManObj(p,iVar2);
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar3 = Vec_IntEntry(p->vEdgeDelay,iVar2);
      iVar4 = Gia_ObjHaveEdge(p,iObj,iVar2);
      if (iVar4 == 0) {
        if (DelayMax <= iVar3 + iVar1) {
          __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x32c,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
        }
        if (iVar3 + iVar1 + 1 == DelayMax) {
          lVar7 = (long)(int)local_74;
          local_74 = local_74 + 1;
          pFanins[lVar7] = iVar2;
        }
      }
      else {
        uVar12 = uVar12 + 1;
        if (DelayMax < iVar3 + iVar1) {
          __assert_fail("Delay1 + Delay2 <= DelayMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                        ,0x324,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
        }
        if (iVar3 + iVar1 == DelayMax) {
          local_68 = local_68 + 1;
        }
        else {
          local_60 = local_60 + 1;
        }
      }
    }
  }
  iVar1 = Vec_IntEntry(p->vEdgeDelay,iObj);
  local_88 = 0;
  local_64 = 0;
  local_5c = 0;
  for (iVar11 = 0; iVar2 = Gia_ObjLutFanoutNum2(p,iObj), iVar11 < iVar2; iVar11 = iVar11 + 1) {
    iVar2 = Gia_ObjLutFanout2(p,iObj,iVar11);
    pGVar6 = Gia_ManObj(p,iVar2);
    if (((int)(uint)*(undefined8 *)pGVar6 < 0) ||
       (((uint)*(undefined8 *)pGVar6 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iNext))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x338,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
    }
    iVar3 = Vec_IntEntry(p->vEdgeDelayR,iVar2);
    iVar4 = Gia_ObjHaveEdge(p,iObj,iVar2);
    if (iVar4 == 0) {
      if (DelayMax <= iVar3 + iVar1) {
        __assert_fail("Delay1 + Delay2 + 1 <= DelayMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x345,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar3 + iVar1 + 1 == DelayMax) {
        if ((int)local_88 < nEdgeLimit) {
          pFanouts[(int)local_88] = iVar2;
        }
        local_88 = local_88 + 1;
      }
    }
    else {
      uVar12 = uVar12 + 1;
      if (DelayMax < iVar3 + iVar1) {
        __assert_fail("Delay1 + Delay2 <= DelayMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x33d,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
      }
      if (iVar3 + iVar1 == DelayMax) {
        local_64 = local_64 + 1;
      }
      else {
        local_5c = local_5c + 1;
      }
    }
  }
  if (fVerbose != 0) {
    printf("%8d : ",iObj);
    printf("Edges = %d  ",(ulong)uVar12);
    uVar5 = Gia_ObjLutSize2(p,iObj);
    printf("Fanins (all %d  EC %d  ENC %d  C %d)  ",(ulong)uVar5,(ulong)local_68,(ulong)local_60,
           (ulong)local_74);
    uVar5 = Gia_ObjLutFanoutNum2(p,iObj);
    printf("Fanouts (all %d  EC %d  ENC %d  C %d)  ",(ulong)uVar5,(ulong)local_64,(ulong)local_5c,
           (ulong)local_88);
  }
  if (nEdgeLimit < (int)uVar12) {
    __assert_fail("nEdges <= nEdgeLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x358,"int Edg_ObjImprove(Gia_Man_t *, int, int, int, int)");
  }
  if (nEdgeLimit == uVar12) {
    if (fVerbose == 0) {
      return 0;
    }
    pcVar10 = "Full";
  }
  else {
    if (((local_68 == 0) && (local_74 != 0)) && ((int)local_74 <= (int)(nEdgeLimit - uVar12))) {
      uVar13 = 0;
      uVar8 = 0;
      if (0 < (int)local_74) {
        uVar8 = (ulong)local_74;
      }
      while ((uVar9 = uVar8, uVar8 != uVar13 &&
             (iVar1 = Gia_ObjEdgeCount(pFanins[uVar13],p->vEdge1,p->vEdge2), uVar9 = uVar13,
             iVar1 != nEdgeLimit))) {
        uVar13 = uVar13 + 1;
      }
      if ((uint)uVar9 == local_74) {
        iVar1 = 0;
        for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
          iVar11 = pFanins[uVar13];
          iVar2 = Gia_ObjEdgeAdd(iObj,iVar11,p->vEdge1,p->vEdge2);
          iVar11 = Gia_ObjEdgeAdd(iVar11,iObj,p->vEdge1,p->vEdge2);
          iVar1 = iVar11 + iVar2 + iVar1;
        }
        if (iVar1 != 0) {
          puts("Wrong number of edges.");
        }
        if (fVerbose == 0) {
          return 1;
        }
        pcVar10 = "Fixed %d critical fanins\n";
        goto LAB_001e4a00;
      }
    }
    if (((local_64 == 0) && (local_88 != 0)) && ((int)local_88 <= (int)(nEdgeLimit - uVar12))) {
      uVar8 = 0;
      uVar13 = 0;
      if (0 < (int)local_88) {
        uVar13 = (ulong)local_88;
      }
      while ((uVar9 = uVar13, uVar13 != uVar8 &&
             (iVar1 = Gia_ObjEdgeCount(pFanouts[uVar8],p->vEdge1,p->vEdge2), uVar9 = uVar8,
             iVar1 != nEdgeLimit))) {
        uVar8 = uVar8 + 1;
      }
      if ((uint)uVar9 == local_88) {
        iVar1 = 0;
        for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
          iVar11 = pFanouts[uVar8];
          iVar2 = Gia_ObjEdgeAdd(iObj,iVar11,p->vEdge1,p->vEdge2);
          iVar11 = Gia_ObjEdgeAdd(iVar11,iObj,p->vEdge1,p->vEdge2);
          iVar1 = iVar11 + iVar2 + iVar1;
        }
        if (iVar1 != 0) {
          puts("Wrong number of edges.");
        }
        if (fVerbose == 0) {
          return 1;
        }
        pcVar10 = "Fixed %d critical fanouts\n";
        local_74 = local_88;
LAB_001e4a00:
        printf(pcVar10,(ulong)local_74);
        return 1;
      }
    }
    if (fVerbose == 0) {
      return 0;
    }
    pcVar10 = "Cannot fix";
  }
  puts(pcVar10);
  return 0;
}

Assistant:

int Edg_ObjImprove( Gia_Man_t * p, int iObj, int nEdgeLimit, int DelayMax, int fVerbose )
{
    int nFaninsC = 0,   nFanoutsC = 0;    // critical
    int nFaninsEC = 0,  nFanoutsEC = 0;   // edge-critical
    int nFaninsENC = 0, nFanoutsENC = 0;  // edge-non-critial
    int pFanins[4], pFanouts[4];
    int nEdgeDiff, nEdges = 0, Count = 0;
    int i, iNext, Delay1, Delay2;
    // count how many fanins have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelayR, iObj );
    //if ( Delay1 > 1 )
    Gia_LutForEachFanin2( p, iObj, iNext, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
            continue;
        Delay2 = Vec_IntEntry( p->vEdgeDelay, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFaninsEC++;
            else
                nFaninsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
                pFanins[nFaninsC++] = iNext;
        }
    }
    // count how many fanouts have critical edge
    Delay1 = Vec_IntEntry( p->vEdgeDelay, iObj );
    //if ( Delay2 < DelayMax - 1 )
    Gia_LutForEachFanout2( p, iObj, iNext, i )
    {
        //if ( !Gia_ObjIsAnd(Gia_ManObj(p, iNext)) )
        //    continue;
        assert( Gia_ObjIsAnd(Gia_ManObj(p, iNext)) );
        Delay2 = Vec_IntEntry( p->vEdgeDelayR, iNext );
        if ( Gia_ObjHaveEdge(p, iObj, iNext) )
        {
            nEdges++;
            assert( Delay1 + Delay2 <= DelayMax );
            if ( Delay1 + Delay2 == DelayMax )
                nFanoutsEC++;
            else
                nFanoutsENC++;
        }
        else
        {
            assert( Delay1 + Delay2 + 1 <= DelayMax );
            if ( Delay1 + Delay2 + 1 == DelayMax )
            {
                if ( nFanoutsC < nEdgeLimit )
                    pFanouts[nFanoutsC] = iNext;
                nFanoutsC++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "%8d : ", iObj );
        printf( "Edges = %d  ", nEdges );
        printf( "Fanins (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutSize2(p, iObj), nFaninsEC, nFaninsENC, nFaninsC );
        printf( "Fanouts (all %d  EC %d  ENC %d  C %d)  ", 
            Gia_ObjLutFanoutNum2(p, iObj), nFanoutsEC, nFanoutsENC, nFanoutsC );
    }
    // consider simple cases
    assert( nEdges <= nEdgeLimit );
    if ( nEdges == nEdgeLimit )
    {
        if ( fVerbose )
            printf( "Full\n" );
        return 0;
    }
    nEdgeDiff = nEdgeLimit - nEdges;
    // check if fanins or fanouts could be improved
    if ( nFaninsEC == 0 && nFaninsC && nFaninsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFaninsC; i++ )
            if ( Gia_ObjEdgeCount(pFanins[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFaninsC )
        {
            for ( i = 0; i < nFaninsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanins[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanins[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanins\n", nFaninsC );
            return 1;
        }
    }
    if ( nFanoutsEC == 0 && nFanoutsC && nFanoutsC <= nEdgeDiff )
    {
        for ( i = 0; i < nFanoutsC; i++ )
            if ( Gia_ObjEdgeCount(pFanouts[i], p->vEdge1, p->vEdge2) == nEdgeLimit )
                break;
        if ( i == nFanoutsC )
        {
            for ( i = 0; i < nFanoutsC; i++ )
            {
                Count += Gia_ObjEdgeAdd( iObj, pFanouts[i], p->vEdge1, p->vEdge2 );
                Count += Gia_ObjEdgeAdd( pFanouts[i], iObj, p->vEdge1, p->vEdge2 );
            }
            if ( Count )
                printf( "Wrong number of edges.\n" );
            if ( fVerbose )
                printf( "Fixed %d critical fanouts\n", nFanoutsC );
            return 1;
        }
    }
    if ( fVerbose )
        printf( "Cannot fix\n" );
    return 0;
}